

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

void __thiscall testing::TestCase::~TestCase(TestCase *this)

{
  TestCase *this_local;
  
  this->_vptr_TestCase = (_func_int **)&PTR__TestCase_002042e8;
  internal::
  ForEach<std::vector<testing::TestInfo*,std::allocator<testing::TestInfo*>>,void(*)(testing::TestInfo*)>
            (&this->test_info_list_,internal::Delete<testing::TestInfo>);
  TestResult::~TestResult(&this->ad_hoc_test_result_);
  std::vector<int,_std::allocator<int>_>::~vector(&this->test_indices_);
  std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::~vector
            (&this->test_info_list_);
  internal::
  scoped_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&this->type_param_);
  std::__cxx11::string::~string((string *)&this->name_);
  return;
}

Assistant:

TestCase::~TestCase() {
  // Deletes every Test in the collection.
  ForEach(test_info_list_, internal::Delete<TestInfo>);
}